

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O2

void conn_free(conn_handle *conn)

{
  void *pvVar1;
  
  pvVar1 = conn->priv;
  if (pvVar1 != (void *)0x0) {
    conn_close(conn);
    mutex_free((mutex_handle *)((long)pvVar1 + 0x90));
    free(conn->priv);
    conn->priv = (void *)0x0;
  }
  return;
}

Assistant:

void conn_free(struct conn_handle *conn)
{
	if (conn->priv != NULL) {
		struct conn_priv *priv = conn->priv;

		conn_close(conn);

#ifdef _WIN32
		WSACleanup();
#endif

		mutex_free(&priv->mutex);

		free(conn->priv);
		conn->priv = NULL;
	}
}